

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateConstantSampler(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  uint32_t uVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  string local_220;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type = inst;
  inst_local = (Instruction *)_;
  uVar1 = Instruction::type_id(inst);
  local_28 = ValidationState_t::FindDef(_,uVar1);
  if ((local_28 != (Instruction *)0x0) &&
     (OVar2 = Instruction::opcode(local_28), OVar2 == OpTypeSampler)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_28);
  pDVar3 = DiagnosticStream::operator<<
                     (&local_200,(char (*) [36])"OpConstantSampler Result Type <id> ");
  this = inst_local;
  uVar1 = Instruction::type_id(result_type);
  ValidationState_t::getIdName_abi_cxx11_(&local_220,(ValidationState_t *)this,uVar1);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_220);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [24])" is not a sampler type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
  std::__cxx11::string::~string((string *)&local_220);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateConstantSampler(ValidationState_t& _,
                                     const Instruction* inst) {
  const auto result_type = _.FindDef(inst->type_id());
  if (!result_type || result_type->opcode() != spv::Op::OpTypeSampler) {
    return _.diag(SPV_ERROR_INVALID_ID, result_type)
           << "OpConstantSampler Result Type <id> "
           << _.getIdName(inst->type_id()) << " is not a sampler type.";
  }

  return SPV_SUCCESS;
}